

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_spell(command_conflict *cmd,char *arg,player *p,int *spell,char *verb,
                     item_tester book_filter,char *book_error,
                     _func__Bool_player_ptr_wchar_t *spell_filter,char *spell_error)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *book;
  item_tester local_40;
  char *local_38;
  
  local_40 = book_filter;
  local_38 = arg;
  wVar2 = cmd_get_arg_choice(cmd,arg,spell);
  if ((wVar2 != L'\0') ||
     ((wVar2 = L'\0', spell_filter != (_func__Bool_player_ptr_wchar_t *)0x0 &&
      (_Var1 = (*spell_filter)(p,*spell), !_Var1)))) {
    wVar2 = cmd_get_arg_item(cmd,"book",&book);
    if (wVar2 == L'\0') {
      wVar2 = get_spell_from_book(p,verb,book,spell_error,spell_filter);
    }
    else {
      wVar2 = get_spell(p,verb,local_40,cmd->code,book_error,spell_filter,spell_error,&book);
    }
    *spell = wVar2;
    if (wVar2 < L'\0') {
      wVar2 = L'\xfffffffd';
    }
    else {
      cmd_set_arg_item(cmd,"book",book);
      cmd_set_arg_choice(cmd,local_38,*spell);
      wVar2 = L'\0';
    }
  }
  return wVar2;
}

Assistant:

int cmd_get_spell(struct command *cmd, const char *arg, struct player *p,
		int *spell,
		const char *verb, item_tester book_filter,
		const char *book_error,
		bool (*spell_filter)(const struct player *p, int spell),
		const char *spell_error)
{
	struct object *book;

	/* See if we've been provided with this one */
	if (cmd_get_arg_choice(cmd, arg, spell) == CMD_OK) {
		/* Ensure it passes the filter */
		if (!spell_filter || spell_filter(p, *spell) == true)
			return CMD_OK;
	}

	/* See if we've been given a book to look at */
	if (cmd_get_arg_item(cmd, "book", &book) == CMD_OK) {
		*spell = get_spell_from_book(p, verb, book, spell_error,
			spell_filter);
	} else {
		*spell = get_spell(p, verb, book_filter, cmd->code, book_error,
			spell_filter, spell_error, &book);
	}

	if (*spell >= 0) {
		cmd_set_arg_item(cmd, "book", book);
		cmd_set_arg_choice(cmd, arg, *spell);
		return CMD_OK;
	}

	return CMD_ARG_ABORTED;
}